

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O2

int WaitForComputerRS232Port(HANDLE hDev,int timeout,int checkingperiod)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  timeval tv;
  fd_set dev_set;
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    dev_set.fds_bits[lVar3] = 0;
  }
  dev_set.fds_bits[(long)hDev / 0x40] =
       dev_set.fds_bits[(long)hDev / 0x40] | 1L << ((byte)hDev & 0x3f);
  tv.tv_sec = (__time_t)(timeout / 1000);
  tv.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
  iVar1 = select((int)hDev + 1,(fd_set *)&dev_set,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
  iVar2 = 1;
  if (iVar1 != -1) {
    iVar2 = (uint)(iVar1 == 0) * 2;
  }
  return iVar2;
}

Assistant:

inline int WaitForComputerRS232Port(HANDLE hDev, int timeout, int checkingperiod)
{
#ifdef _WIN32
	COMSTAT stats;
	CHRONO chrono;

	StartChrono(&chrono);
	do
	{
		memset(&stats, 0, sizeof(COMSTAT));
		if (ClearCommError(hDev, NULL, &stats))
		{
			if (stats.cbInQue <= 0) mSleep(checkingperiod);
			else
			{
				StopChronoQuick(&chrono);
				return EXIT_SUCCESS;
			}
		}
		else
		{
			StopChronoQuick(&chrono);
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("WaitForComputerRS232Port error (%s) : %s"
				"(hDev=%#x, timeout=%d, checkingperiod=%d)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, timeout, checkingperiod));
			return EXIT_FAILURE;
		}
	} while (GetTimeElapsedChronoQuick(&chrono) <= timeout);
	StopChronoQuick(&chrono);
	return EXIT_TIMEOUT;
#else
#ifdef DISABLE_SELECT_OSCOMPUTERRS232PORT
	CHRONO chrono;

	StartChrono(&chrono);
	do
	{
		int bytes_avail = 0;

		if (ioctl((intptr_t)hDev, FIONREAD, &bytes_avail) == EXIT_SUCCESS)
		{
			if (bytes_avail <= 0) mSleep(checkingperiod);
			else
			{
				StopChronoQuick(&chrono);
				return EXIT_SUCCESS;
			}
		}
		else
		{
			StopChronoQuick(&chrono);
			PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("WaitForComputerRS232Port error (%s) : (FIONREAD) %s"
				"(hDev=%#x, timeout=%d, checkingperiod=%d)\n",
				strtime_m(),
				GetLastErrorMsg(),
				hDev, timeout, checkingperiod));
			return EXIT_FAILURE;
		}
	} while (GetTimeElapsedChronoQuick(&chrono) <= timeout);
	StopChronoQuick(&chrono);
	return EXIT_TIMEOUT;
#else
	fd_set dev_set;
	int iResult = -1;
	struct timeval tv;

	UNREFERENCED_PARAMETER(checkingperiod);

	// Initialize a fd_set and add the socket to it.
	FD_ZERO(&dev_set);
	FD_SET((intptr_t)hDev, &dev_set);

	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);

	// Wait for the readability of the device in the fd_set, with a timeout.
	iResult = select((int)(intptr_t)hDev+1, &dev_set, NULL, NULL, &tv);

	// Remove the device from the set.
	FD_CLR((intptr_t)hDev, &dev_set);

	if (iResult == -1)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("WaitForComputerRS232Port error (%s) : %s"
			"(hDev=%#x, timeout=%d, checkingperiod=%d)\n",
			strtime_m(),
			"select failed. ",
			hDev, timeout, checkingperiod));
		return EXIT_FAILURE;
	}

	if (iResult == 0)
	{
		// The timeout on select() occured.
		return EXIT_TIMEOUT;
	}

	return EXIT_SUCCESS;
#endif // DISABLE_SELECT_OSCOMPUTERRS232PORT
#endif // _WIN32
}